

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall despot::util::tinyxml::TiXmlElement::RemoveAttribute(TiXmlElement *this,char *name)

{
  int iVar1;
  TiXmlAttributeSet *this_00;
  TiXmlAttribute *removeMe;
  
  this_00 = &this->attributeSet;
  removeMe = &this_00->sentinel;
  do {
    removeMe = removeMe->next;
    if (removeMe == &this_00->sentinel) {
      removeMe = (TiXmlAttribute *)0x0;
      break;
    }
    iVar1 = strcmp(((removeMe->name).rep_)->str,name);
  } while (iVar1 != 0);
  if (removeMe == (TiXmlAttribute *)0x0) {
    return;
  }
  TiXmlAttributeSet::Remove(this_00,removeMe);
  (*(removeMe->super_TiXmlBase)._vptr_TiXmlBase[1])(removeMe);
  return;
}

Assistant:

void TiXmlElement::RemoveAttribute(const char * name) {
#ifdef TIXML_USE_STL
	TIXML_STRING str( name );
	TiXmlAttribute* node = attributeSet.Find( str );
#else
	TiXmlAttribute* node = attributeSet.Find(name);
#endif
	if (node) {
		attributeSet.Remove(node);
		delete node;
	}
}